

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsat.hpp
# Opt level: O0

void __thiscall subsat::Solver::unassign(Solver *this,Lit lit)

{
  Var var;
  reference pvVar1;
  Lit *this_00;
  DecisionQueue *this_01;
  long in_RDI;
  vector_map_t<subsat::Lit,_subsat::Value,_std::allocator<subsat::Value>,_subsat::IndexMember<subsat::Lit>_>
  *in_stack_ffffffffffffffd8;
  key_type in_stack_ffffffffffffffe4;
  
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
  pvVar1 = vector_map_t<subsat::Lit,_subsat::Value,_std::allocator<subsat::Value>,_subsat::IndexMember<subsat::Lit>_>
           ::operator[](in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4);
  *pvVar1 = Unassigned;
  this_00 = (Lit *)(in_RDI + 0x18);
  Lit::operator~(this_00);
  pvVar1 = vector_map_t<subsat::Lit,_subsat::Value,_std::allocator<subsat::Value>,_subsat::IndexMember<subsat::Lit>_>
           ::operator[](in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4);
  *pvVar1 = Unassigned;
  this_01 = (DecisionQueue *)(in_RDI + 0x60);
  var = Lit::var(this_00);
  DecisionQueue::unassign(this_01,var);
  return;
}

Assistant:

void unassign(Lit lit)
  {
    ASS(m_unassigned_vars < m_used_vars);
    m_unassigned_vars += 1;

    ASS_EQ(m_values[lit], Value::True);
    ASS_EQ(m_values[~lit], Value::False);
    m_values[lit] = Value::Unassigned;
    m_values[~lit] = Value::Unassigned;

#if SUBSAT_VDOM
    m_vdom.unassigned(lit.var());
#endif
#if SUBSAT_VMTF
    m_queue.unassign(lit.var());
#endif
  }